

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

void __thiscall FStrifeDialogueNode::~FStrifeDialogueNode(FStrifeDialogueNode *this)

{
  FStrifeDialogueReply *pFVar1;
  FStrifeDialogueReply *next;
  FStrifeDialogueReply *tokill;
  FStrifeDialogueNode *this_local;
  
  if ((this->SpeakerName != (char *)0x0) && (this->SpeakerName != (char *)0x0)) {
    operator_delete__(this->SpeakerName);
  }
  if ((this->Dialogue != (char *)0x0) && (this->Dialogue != (char *)0x0)) {
    operator_delete__(this->Dialogue);
  }
  pFVar1 = this->Children;
  while (next = pFVar1, next != (FStrifeDialogueReply *)0x0) {
    pFVar1 = next->Next;
    if (next != (FStrifeDialogueReply *)0x0) {
      FStrifeDialogueReply::~FStrifeDialogueReply(next);
      operator_delete(next,0x68);
    }
  }
  TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::~TArray(&this->ItemCheck);
  return;
}

Assistant:

FStrifeDialogueNode::~FStrifeDialogueNode ()
{
	if (SpeakerName != NULL) delete[] SpeakerName;
	if (Dialogue != NULL) delete[] Dialogue;
	FStrifeDialogueReply *tokill = Children;
	while (tokill != NULL)
	{
		FStrifeDialogueReply *next = tokill->Next;
		delete tokill;
		tokill = next;
	}
}